

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

void sysbvm_context_setIntrinsicTypeMetadata
               (sysbvm_context_t *context,sysbvm_tuple_t type,char *name,sysbvm_tuple_t supertype,
               ...)

{
  char in_AL;
  uint uVar1;
  sysbvm_tuple_t sVar2;
  size_t sVar3;
  sysbvm_tuple_t *psVar4;
  sysbvm_tuple_t sVar5;
  long *plVar6;
  ulong uVar7;
  long *plVar8;
  sysbvm_tuple_t *psVar9;
  size_t localIndex;
  undefined8 in_R8;
  sysbvm_tuple_t type_00;
  undefined8 in_R9;
  long lVar10;
  bool bVar11;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list valist;
  sysbvm_tuple_t *local_110;
  sysbvm_tuple_t local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_c8 = in_R8;
  local_c0 = in_R9;
  sVar2 = sysbvm_symbol_internWithCString(context,name);
  if (((supertype != 0) && ((type & 0xf) == 0 && type != 0)) && ((*(byte *)(type + 8) & 0x80) == 0))
  {
    *(sysbvm_tuple_t *)(type + 0x30) = supertype;
  }
  sysbvm_namespace_setNewSymbolBindingWithValue(context,(context->roots).globalNamespace,sVar2,type)
  ;
  sysbvm_orderedCollection_add(context,(context->roots).intrinsicTypes,type);
  uVar1 = 0x20;
  lVar10 = 0;
  plVar8 = (long *)&stack0x00000008;
  while( true ) {
    if (uVar1 < 0x29) {
      uVar7 = (ulong)uVar1;
      uVar1 = uVar1 + 8;
      plVar6 = plVar8;
      plVar8 = (long *)((long)local_e8 + uVar7);
    }
    else {
      plVar6 = plVar8 + 1;
    }
    if (*plVar8 == 0) break;
    if (uVar1 < 0x29) {
      uVar1 = uVar1 + 8;
    }
    else {
      plVar6 = plVar6 + 1;
    }
    if (uVar1 < 0x29) {
      uVar1 = uVar1 + 8;
    }
    else {
      plVar6 = plVar6 + 1;
    }
    lVar10 = lVar10 + -1;
    plVar8 = plVar6;
  }
  bVar11 = (type & 0xf) == 0;
  if ((bVar11 && type != 0) && ((*(byte *)(type + 8) & 0x80) == 0)) {
    sVar2 = *(sysbvm_tuple_t *)(type + 0x30);
  }
  else {
    sVar2 = 0;
  }
  if ((sVar2 & 0xf) == 0 && sVar2 != 0) {
    sVar3 = sysbvm_type_getTotalSlotCount(sVar2);
  }
  else {
    sVar3 = 0;
  }
  sVar2 = sysbvm_array_create(context,-lVar10);
  uVar1 = 0x20;
  local_110 = (sysbvm_tuple_t *)&stack0x00000008;
  if (lVar10 != 0) {
    localIndex = 0;
    do {
      uVar7 = (ulong)uVar1;
      if (uVar7 < 0x29) {
        uVar1 = uVar1 + 8;
        psVar4 = (sysbvm_tuple_t *)((long)local_e8 + uVar7);
      }
      else {
        psVar4 = local_110;
        local_110 = local_110 + 1;
      }
      sVar5 = sysbvm_symbol_internWithCString(context,(char *)*psVar4);
      uVar7 = (ulong)uVar1;
      if (uVar7 < 0x29) {
        uVar1 = uVar1 + 8;
        psVar4 = (sysbvm_tuple_t *)((long)local_e8 + uVar7);
      }
      else {
        psVar4 = local_110;
        local_110 = local_110 + 1;
      }
      uVar7 = (ulong)uVar1;
      if (uVar7 < 0x29) {
        uVar1 = uVar1 + 8;
        psVar9 = (sysbvm_tuple_t *)((long)local_e8 + uVar7);
      }
      else {
        psVar9 = local_110;
        local_110 = local_110 + 1;
      }
      type_00 = *psVar9;
      if (type_00 == 0) {
        type_00 = (context->roots).anyValueType;
      }
      sVar5 = sysbvm_typeSlot_create
                        (context,type,sVar5,(long)(int)*psVar4 << 4 | 0xb,type_00,localIndex,
                         sVar3 + localIndex);
      if ((sVar2 & 0xf) == 0 && sVar2 != 0) {
        *(sysbvm_tuple_t *)(sVar2 + 0x10 + localIndex * 8) = sVar5;
      }
      localIndex = localIndex + 1;
    } while (-localIndex != lVar10);
  }
  if (bVar11 && type != 0) {
    *(sysbvm_tuple_t *)(type + 0x38) = sVar2;
  }
  sysbvm_type_setTotalSlotCount(context,type,sVar3 - lVar10);
  sysbvm_type_buildSlotDictionary(context,type);
  return;
}

Assistant:

static void sysbvm_context_setIntrinsicTypeMetadata(sysbvm_context_t *context, sysbvm_tuple_t type, const char *name, sysbvm_tuple_t supertype, ...)
{
    sysbvm_tuple_t nameSymbol = sysbvm_symbol_internWithCString(context, name);
    if(supertype)
        sysbvm_type_setSupertype(type, supertype);
    sysbvm_namespace_setNewSymbolBindingWithValue(context, context->roots.globalNamespace, nameSymbol, type);
    sysbvm_orderedCollection_add(context, context->roots.intrinsicTypes, type);

    // First pass: count the arguments.
    size_t slotNameCount = 0;
    va_list valist;
    va_start(valist, supertype);
    while(va_arg(valist, const char *))
    {
        va_arg(valist, sysbvm_typeSlotFlags_t);
        va_arg(valist, int);
        ++slotNameCount;
    }
    va_end(valist);

    // Second pass: make the argument list.
    size_t supertypeTotalSlotCount = 0;
    sysbvm_tuple_t actualSupertype = sysbvm_type_getSupertype(type);
    if(sysbvm_tuple_isNonNullPointer(actualSupertype))
        supertypeTotalSlotCount = sysbvm_type_getTotalSlotCount(actualSupertype);

    sysbvm_tuple_t slots = sysbvm_array_create(context, slotNameCount);
    va_start(valist, supertype);
    for(size_t i = 0; i < slotNameCount; ++i)
    {
        sysbvm_tuple_t slotName = sysbvm_symbol_internWithCString(context, va_arg(valist, const char *));
        sysbvm_tuple_t flags = sysbvm_tuple_bitflags_encode(va_arg(valist, int));
        sysbvm_tuple_t slotType = va_arg(valist, sysbvm_tuple_t);
        if(!slotType)
            slotType = context->roots.anyValueType;
        sysbvm_array_atPut(slots, i, sysbvm_typeSlot_create(context, type, slotName, flags, slotType, i, supertypeTotalSlotCount + i));
    }

    va_end(valist);
    sysbvm_type_setSlots(type, slots);
    sysbvm_type_setTotalSlotCount(context, type, supertypeTotalSlotCount + slotNameCount);
    sysbvm_type_buildSlotDictionary(context, type);
}